

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void __thiscall Matrix<double>::add_row(Matrix<double> *this,uint n_row)

{
  vector<double,_std::allocator<double>_> local_38;
  uint local_18;
  uint local_14;
  uint i;
  uint n_row_local;
  Matrix<double> *this_local;
  
  (this->m_shape).n_row = n_row + (this->m_shape).n_row;
  local_14 = n_row;
  _i = this;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector(&local_38);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&this->m_elems,&local_38);
    std::vector<double,_std::allocator<double>_>::~vector(&local_38);
  }
  return;
}

Assistant:

void Matrix<T>::add_row(unsigned n_row){
    m_shape.n_row+=n_row;
    for(unsigned i=0;i<n_row;++i)
        m_elems.push_back(std::vector<T>());
}